

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::LinkEndChild(TiXmlNode *this,TiXmlNode *node)

{
  TiXmlNode *pTVar1;
  TiXmlDocument *pTVar2;
  TiXmlDocument *pTVar3;
  TiXmlNode **ppTVar4;
  
  if (node->parent != this && node->parent != (TiXmlNode *)0x0) {
    __assert_fail("node->parent == 0 || node->parent == this",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                  ,0x9d,"TiXmlNode *despot::util::tinyxml::TiXmlNode::LinkEndChild(TiXmlNode *)");
  }
  pTVar2 = GetDocument(node);
  if (pTVar2 != (TiXmlDocument *)0x0) {
    pTVar2 = GetDocument(node);
    pTVar3 = GetDocument(this);
    if (pTVar2 != pTVar3) {
      __assert_fail("node->GetDocument() == 0 || node->GetDocument() == this->GetDocument()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                    ,0x9f,"TiXmlNode *despot::util::tinyxml::TiXmlNode::LinkEndChild(TiXmlNode *)");
    }
  }
  if (node->type == DOCUMENT) {
    (*(node->super_TiXmlBase)._vptr_TiXmlBase[1])(node);
    pTVar2 = GetDocument(this);
    if (pTVar2 == (TiXmlDocument *)0x0) {
      node = (TiXmlNode *)0x0;
    }
    else {
      pTVar2 = GetDocument(this);
      node = (TiXmlNode *)0x0;
      TiXmlDocument::SetError
                (pTVar2,0x10,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
    }
  }
  else {
    node->parent = this;
    pTVar1 = this->lastChild;
    node->prev = pTVar1;
    node->next = (TiXmlNode *)0x0;
    ppTVar4 = &pTVar1->next;
    if (pTVar1 == (TiXmlNode *)0x0) {
      ppTVar4 = &this->firstChild;
    }
    *ppTVar4 = node;
    this->lastChild = node;
  }
  return node;
}

Assistant:

TiXmlNode* TiXmlNode::LinkEndChild(TiXmlNode* node) {
	assert(node->parent == 0 || node->parent == this);
	assert(
		node->GetDocument() == 0 || node->GetDocument() == this->GetDocument());

	if (node->Type() == TiXmlNode::DOCUMENT) {
		delete node;
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}

	node->parent = this;

	node->prev = lastChild;
	node->next = 0;

	if (lastChild)
		lastChild->next = node;
	else
		firstChild = node; // it was an empty list.

	lastChild = node;
	return node;
}